

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O1

void __thiscall test_b_tree::test_lots_of_inserts_and_removes(test_b_tree *this)

{
  char *__filename;
  pointer plVar1;
  runtime_error *prVar2;
  pointer plVar3;
  bool bVar4;
  optional<long> oVar5;
  vector<long,_std::allocator<long>_> keys;
  b_tree t;
  string local_b0;
  vector<long,_std::allocator<long>_> local_90;
  b_tree local_78;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"test.db","");
  b_tree::b_tree(&local_78,&local_b0,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  std::vector<long,_std::allocator<long>_>::vector(&local_90,&test_keys);
  do {
    plVar1 = local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      if (local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (int64_t *)0x0) {
        operator_delete(local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pager::~pager(&local_78._p);
      return;
    }
    bVar4 = false;
    plVar3 = local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      oVar5 = b_tree::search(&local_78,*plVar3);
      if (((undefined1  [16])
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      break;
      plVar3 = plVar3 + 1;
      bVar4 = plVar3 == plVar1;
    } while (!bVar4);
    if (!bVar4) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      rtf_format_abi_cxx11_
                (&local_b0,"%s at Line:%d File:%s","has_all_keys(t, keys)",0x7f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
                );
      std::runtime_error::runtime_error(prVar2,(string *)&local_b0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __filename = (char *)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1];
    local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
    oVar5 = b_tree::search(&local_78,(int64_t)__filename);
    if (((undefined1  [16])
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      rtf_format_abi_cxx11_
                (&local_b0,"%s at Line:%d File:%s","t.search(k)",0x83,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
                );
      std::runtime_error::runtime_error(prVar2,(string *)&local_b0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    b_tree::remove(&local_78,__filename);
    oVar5 = b_tree::search(&local_78,(int64_t)__filename);
    if (((undefined1  [16])
         oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      rtf_format_abi_cxx11_
                (&local_b0,"%s at Line:%d File:%s","!t.search(k)",0x85,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
                );
      std::runtime_error::runtime_error(prVar2,(string *)&local_b0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  } while( true );
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}